

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::RepeatedField_CheckedMutableOrAbortTest_Test::
~RepeatedField_CheckedMutableOrAbortTest_Test(RepeatedField_CheckedMutableOrAbortTest_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(RepeatedField, CheckedMutableOrAbortTest) {
  RepeatedField<int> field;

  // Empty container tests.
  EXPECT_DEATH(CheckedMutableOrAbort(&field, -1), "index: -1, size: 0");
  EXPECT_DEATH(CheckedMutableOrAbort(&field, field.size()),
               "index: 0, size: 0");

  // Non-empty container tests
  field.Add(5);
  field.Add(4);
  EXPECT_DEATH(CheckedMutableOrAbort(&field, 2), "index: 2, size: 2");
  EXPECT_DEATH(CheckedMutableOrAbort(&field, -1), "index: -1, size: 2");
}